

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  long lVar4;
  long lVar5;
  Pgno parent;
  Pgno PVar6;
  BtreePayload *pBVar7;
  BtCursor *pCur_00;
  int iVar8;
  void *pvVar9;
  size_t __n;
  MemPage *pMVar10;
  u64 v;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  u8 *__s;
  uint *pCell;
  int loc;
  int rc;
  MemPage *pOvfl;
  int local_a4;
  int local_a0;
  Pgno local_9c;
  uint local_98;
  int local_94;
  BtreePayload *local_90;
  KeyInfo *local_88;
  MemPage *local_80;
  int local_74;
  uint *local_70;
  ulong local_68;
  BtCursor *local_60;
  uint *local_58;
  UnpackedRecord local_50;
  BtShared *local_38;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  pBVar3 = pBtree->pBt;
  local_a4 = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (iVar8 = saveAllCursors(pBVar3,pCur->pgnoRoot,pCur), iVar8 != 0)) {
    return iVar8;
  }
  local_50.pKeyInfo = pCur->pKeyInfo;
  local_94 = flags;
  if (local_50.pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pX->nKey,0);
    if ((pCur->curFlags & 2) == 0) {
LAB_00136c29:
      if (seekResult == 0) {
        iVar8 = sqlite3BtreeMovetoUnpacked
                          (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(local_94 != 0),&local_a4);
        goto joined_r0x00136c50;
      }
    }
    else {
      lVar4 = pX->nKey;
      lVar5 = (pCur->info).nKey;
      if (lVar4 == lVar5) {
        local_a4 = 0;
      }
      else {
        if (lVar5 != lVar4 + -1 || lVar4 < 1) goto LAB_00136c29;
        local_a4 = -1;
      }
    }
  }
  else {
    if ((flags & 2U) != 0 || seekResult != 0) goto LAB_00136cbd;
    if (pX->nMem == 0) {
      iVar8 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_a4);
      local_a0 = iVar8;
    }
    else {
      local_50.aMem = pX->aMem;
      local_50.default_rc = '\0';
      local_50.errCode = '\0';
      local_50.r1 = '\0';
      local_50.r2 = '\0';
      local_50._22_2_ = local_50._22_2_ & 0xff00;
      local_50.nField = pX->nMem;
      iVar8 = sqlite3BtreeMovetoUnpacked(pCur,&local_50,0,(uint)(flags != 0),&local_a4);
      local_a0 = iVar8;
    }
joined_r0x00136c50:
    if (iVar8 != 0) {
      return iVar8;
    }
  }
LAB_00136cbd:
  pMVar10 = pCur->apPage[pCur->iPage];
  pCell = (uint *)pBVar3->pTmpSpace;
  local_50.pKeyInfo = (KeyInfo *)0x0;
  pBVar3 = pMVar10->pBt;
  local_9c = 0;
  bVar1 = pMVar10->childPtrSize;
  uVar16 = (ulong)bVar1;
  local_90 = pX;
  local_80 = pMVar10;
  local_60 = pCur;
  if (pMVar10->intKey == '\0') {
    pvVar9 = pX->pKey;
    uVar14 = pX->nKey;
    if ((uint)uVar14 < 0x80) {
      *(u8 *)((long)pCell + uVar16) = (u8)uVar14;
      uVar15 = 1;
    }
    else {
      uVar15 = sqlite3PutVarint((uchar *)((long)pCell + uVar16),(long)(int)(uint)uVar14);
      uVar15 = uVar15 & 0xff;
    }
    iVar8 = uVar15 + bVar1;
    v = uVar14 & 0xffffffff;
  }
  else {
    local_68 = (ulong)pX->nData;
    v = (long)pX->nZero + local_68;
    pvVar9 = pX->pData;
    if ((uint)v < 0x80) {
      *(u8 *)((long)pCell + uVar16) = (u8)v;
      uVar15 = 1;
    }
    else {
      uVar15 = sqlite3PutVarint((uchar *)((long)pCell + uVar16),v);
      uVar15 = uVar15 & 0xff;
    }
    uVar15 = uVar15 + bVar1;
    iVar8 = sqlite3PutVarint((uchar *)((long)pCell + (ulong)uVar15),local_90->nKey);
    iVar8 = iVar8 + uVar15;
    uVar14 = local_68;
    pMVar10 = local_80;
  }
  iVar11 = (int)v;
  if ((int)(uint)pMVar10->maxLocal < iVar11) {
    uVar2 = pMVar10->minLocal;
    uVar15 = (iVar11 - (uint)uVar2) % (pMVar10->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pMVar10->maxLocal < (int)uVar15) {
      uVar15 = (uint)uVar2;
    }
    uVar16 = (ulong)uVar15;
    local_98 = uVar15 + iVar8 + 4;
    puVar17 = (uint *)((long)(int)(uVar15 + iVar8) + (long)pCell);
LAB_00136e20:
    __s = (u8 *)((long)iVar8 + (long)pCell);
    local_88 = (KeyInfo *)0x0;
    local_70 = pCell;
    local_58 = puVar17;
    local_38 = pBVar3;
    do {
      pBVar3 = local_38;
      parent = local_9c;
      iVar8 = (int)uVar16;
      local_68 = v;
      if (iVar8 == 0) {
        if (local_38->autoVacuum != '\0') {
          do {
            uVar12 = local_9c;
            local_9c = uVar12 + 1;
            uVar15 = 0;
            if (1 < local_9c) {
              iVar8 = (uVar12 - 1) - (uVar12 - 1) % (local_38->usableSize / 5 + 1);
              uVar15 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / local_38->pageSize) +
                       2;
            }
          } while ((local_9c == uVar15) || (uVar12 == (uint)sqlite3PendingByte / local_38->pageSize)
                  );
          local_9c = uVar12 + 1;
        }
        iVar8 = allocateBtreePage(local_38,(MemPage **)&local_50,&local_9c,local_9c,'\0');
        PVar6 = local_9c;
        local_74 = iVar8;
        if ((pBVar3->autoVacuum == '\0') || (iVar8 != 0)) {
          if (iVar8 == 0) goto LAB_00136f41;
        }
        else {
          ptrmapPut(pBVar3,local_9c,'\x04' - (parent == 0),parent,&local_74);
          iVar8 = local_74;
          if (local_74 == 0) {
LAB_00136f41:
            *local_58 = PVar6 >> 0x18 | (PVar6 & 0xff0000) >> 8 | (PVar6 & 0xff00) << 8 |
                        PVar6 << 0x18;
            if (local_88 != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull((DbPage *)local_88[2].aColl[0]);
            }
            local_58 = *(uint **)(local_50.pKeyInfo + 2);
            *local_58 = 0;
            local_88 = local_50.pKeyInfo;
            __s = (u8 *)(*(long *)(local_50.pKeyInfo + 2) + 4);
            iVar8 = pBVar3->usableSize - 4;
            goto LAB_00136f8c;
          }
          if (local_50.pKeyInfo != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_50.pKeyInfo[2].aColl[0]);
          }
        }
        if (local_88 == (KeyInfo *)0x0) {
          return iVar8;
        }
        goto LAB_00137051;
      }
LAB_00136f8c:
      iVar11 = iVar8;
      if ((int)local_68 < iVar8) {
        iVar11 = (int)local_68;
      }
      iVar13 = (int)uVar14;
      if (iVar13 < 1) {
        __n = (size_t)iVar11;
        memset(__s,0,__n);
      }
      else {
        if (iVar13 <= iVar11) {
          iVar11 = iVar13;
        }
        __n = (size_t)iVar11;
        memcpy(__s,pvVar9,__n);
      }
      __s = __s + __n;
      pvVar9 = (void *)((long)pvVar9 + __n);
      uVar14 = (ulong)(uint)(iVar13 - iVar11);
      uVar16 = (ulong)(uint)(iVar8 - iVar11);
      uVar15 = (int)local_68 - iVar11;
      v = (u64)uVar15;
    } while (uVar15 != 0 && iVar11 <= (int)local_68);
    iVar8 = 0;
    pCell = local_70;
    if (local_88 != (KeyInfo *)0x0) {
LAB_00137051:
      pCell = local_70;
      sqlite3PagerUnrefNotNull((DbPage *)local_88[2].aColl[0]);
      local_a0 = iVar8;
      if (iVar8 != 0) {
        return iVar8;
      }
      goto LAB_00137072;
    }
  }
  else {
    local_98 = 4;
    if (4 < iVar11 + iVar8) {
      local_98 = iVar11 + iVar8;
    }
    uVar16 = v & 0xffffffff;
    puVar17 = pCell;
    if (0 < iVar11) goto LAB_00136e20;
  }
  local_a0 = 0;
LAB_00137072:
  pCur_00 = local_60;
  pMVar10 = local_80;
  uVar2 = local_60->aiIdx[local_60->iPage];
  uVar15 = (uint)uVar2;
  if (local_a4 == 0) {
    iVar8 = sqlite3PagerWrite(local_80->pDbPage);
    if (iVar8 != 0) {
      return iVar8;
    }
    puVar17 = (uint *)(pMVar10->aData +
                      (CONCAT11(pMVar10->aCellIdx[(ulong)uVar2 * 2],
                                pMVar10->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar10->maskPage));
    if (pMVar10->leaf == '\0') {
      *pCell = *puVar17;
    }
    local_a0 = clearCell(pMVar10,(uchar *)puVar17,(CellInfo *)&local_50);
    pMVar10 = local_80;
    if ((local_98 == (ushort)local_50._22_2_) &&
       (CONCAT22(local_50._18_2_,local_50.nField) == (uint)(ushort)local_50._20_2_)) {
      if (local_80->aDataEnd < (u8 *)((long)puVar17 + (ulong)local_98)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1058f,
                    "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
        return 0xb;
      }
      memcpy(puVar17,pCell,(ulong)local_98);
      return 0;
    }
    dropCell(local_80,(uint)uVar2,(uint)(ushort)local_50._22_2_,&local_a0);
    if (local_a0 != 0) {
      return local_a0;
    }
  }
  else if ((local_a4 < 0) && (local_80->nCell != 0)) {
    local_60->aiIdx[local_60->iPage] = uVar2 + 1;
    uVar15 = (uint)(ushort)(uVar2 + 1);
  }
  pBVar7 = local_90;
  insertCell(pMVar10,uVar15,(u8 *)pCell,local_98,(u8 *)0x0,0,&local_a0);
  (pCur_00->info).nSize = 0;
  iVar8 = local_a0;
  if (pMVar10->nOverflow != '\0') {
    pCur_00->curFlags = pCur_00->curFlags & 0xfd;
    iVar8 = balance(pCur_00);
    pCur_00->apPage[pCur_00->iPage]->nOverflow = '\0';
    pCur_00->eState = '\0';
    if ((iVar8 == 0 & (byte)local_94 >> 1) == 1) {
      iVar8 = moveToRoot(pCur_00);
      if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
        pvVar9 = sqlite3Malloc(pBVar7->nKey);
        pCur_00->pKey = pvVar9;
        if (pvVar9 == (void *)0x0) {
          iVar8 = 7;
        }
        else {
          memcpy(pvVar9,pBVar7->pKey,pBVar7->nKey);
        }
      }
      pCur_00->eState = '\x03';
      pCur_00->nKey = pBVar7->nKey;
    }
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey>0
               && pCur->info.nKey==pX->nKey-1 ){
      loc = -1;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->aiIdx[pCur->iPage];
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->aiIdx[pCur->iPage];
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}